

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsDoubleToNumber(double dbl,JsValueRef *asValue)

{
  anon_class_16_2_836bb1da fn;
  bool bVar1;
  JsValueRef *local_20;
  JsValueRef *asValue_local;
  double dbl_local;
  
  if (asValue == (JsValueRef *)0x0) {
    dbl_local._4_4_ = JsErrorNullArgument;
  }
  else {
    local_20 = asValue;
    asValue_local = (JsValueRef *)dbl;
    bVar1 = Js::JavascriptNumber::TryToVarFastWithCheck(dbl,asValue);
    if (bVar1) {
      dbl_local._4_4_ = JsNoError;
    }
    else {
      fn.asValue = &local_20;
      fn.dbl = (double *)&asValue_local;
      dbl_local._4_4_ = ContextAPINoScriptWrapper<JsDoubleToNumber::__0>(fn,false,false);
    }
  }
  return dbl_local._4_4_;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsDoubleToNumber(_In_ double dbl, _Out_ JsValueRef *asValue)
{
    PARAM_NOT_NULL(asValue);
    //If number is not heap allocated then we don't need to record/track the creation for time-travel
    if (Js::JavascriptNumber::TryToVarFastWithCheck(dbl, asValue))
    {
      return JsNoError;
    }

    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateNumber, dbl);

        *asValue = Js::JavascriptNumber::ToVarNoCheck(dbl, scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, asValue);

        return JsNoError;
    });
}